

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
* __thiscall
phmap::priv::
btree<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>
::insert_hint_unique<std::pair<long_const,long>const&>
          (pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
           *__return_storage_ptr__,
          btree<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>
          *this,iterator position,key_type *key,pair<const_long,_long> *args)

{
  ulong uVar1;
  iterator iVar2;
  iterator prev;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
  local_48;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
  local_38;
  
  local_48.node = position.node;
  local_48.position = position.position;
  if (*(long *)(this + 0x10) == 0) {
LAB_002109d1:
    insert_unique<std::pair<long_const,long>const&>(__return_storage_ptr__,this,key,args);
  }
  else {
    iVar2 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
            ::end((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                   *)this);
    if (local_48.node == iVar2.node && local_48.position == iVar2.position) {
LAB_00210922:
      local_38._12_4_ = local_48._12_4_;
      local_38.position = local_48.position;
      local_38.node = local_48.node;
      iVar2 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
              ::begin((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                       *)this);
      if ((local_48.node != iVar2.node) || (local_48.position != iVar2.position)) {
        btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
        ::decrement(&local_38);
        if (((ulong)local_38.node & 7) != 0) {
LAB_00210a00:
          __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                        ,0xf84,
                        "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                       );
        }
        if (*key <= *(long *)(local_38.node + (long)local_38.position * 0x10 + 0x10))
        goto LAB_002109d1;
      }
      uVar1 = (ulong)(uint)local_48.position;
    }
    else {
      if (((ulong)local_48.node & 7) != 0) goto LAB_00210a00;
      if (*key < *(long *)(local_48.node + (long)local_48.position * 0x10 + 0x10))
      goto LAB_00210922;
      if (*key <= *(long *)(local_48.node + (long)local_48.position * 0x10 + 0x10)) {
        (__return_storage_ptr__->first).node = local_48.node;
        *(ulong *)&(__return_storage_ptr__->first).position =
             CONCAT44(local_48._12_4_,local_48.position);
        __return_storage_ptr__->second = false;
        return __return_storage_ptr__;
      }
      btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
      ::increment(&local_48);
      iVar2 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
              ::end((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                     *)this);
      uVar1 = (ulong)(uint)local_48.position;
      if (local_48.node != iVar2.node || local_48.position != iVar2.position) {
        if (((ulong)local_48.node & 7) != 0) goto LAB_00210a00;
        if (*(long *)(local_48.node + (long)local_48.position * 0x10 + 0x10) <= *key)
        goto LAB_002109d1;
      }
    }
    iVar2._8_8_ = uVar1;
    iVar2.node = local_48.node;
    iVar2 = internal_emplace<std::pair<long_const,long>const&>(this,iVar2,args);
    (__return_storage_ptr__->first).node = iVar2.node;
    (__return_storage_ptr__->first).position = iVar2.position;
    __return_storage_ptr__->second = true;
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto btree<P>::insert_hint_unique(iterator position, const key_type &key,
                                             Args &&... args)
        -> std::pair<iterator, bool> {
        if (!empty()) {
            if (position == end() || compare_keys(key, position.key())) {
                iterator prev = position;
                if (position == begin() || compare_keys((--prev).key(), key)) {
                    // prev.key() < key < position.key()
                    return {internal_emplace(position, std::forward<Args>(args)...), true};
                }
            } else if (compare_keys(position.key(), key)) {
                ++position;
                if (position == end() || compare_keys(key, position.key())) {
                    // {original `position`}.key() < key < {current `position`}.key()
                    return {internal_emplace(position, std::forward<Args>(args)...), true};
                }
            } else {
                // position.key() == key
                return {position, false};
            }
        }
        return insert_unique(key, std::forward<Args>(args)...);
    }